

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O0

void write_cb(uv_write_t *req,int status)

{
  FILE *__stream;
  char *pcVar1;
  int status_local;
  uv_write_t *req_local;
  
  __stream = _stderr;
  if (req == (uv_write_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x65,"req != NULL");
    abort();
  }
  if (status != 0) {
    pcVar1 = uv_strerror(status);
    fprintf(__stream,"uv_write error: %s\n",pcVar1);
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x69,"0");
    abort();
  }
  bytes_sent_done = bytes_sent_done + 0x2728000;
  write_cb_called = write_cb_called + 1;
  return;
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  if (status == 0)
    write_callbacks++;
  else if (status == UV_ECANCELED)
    write_cancelled_callbacks++;
  else
    write_error_callbacks++;
}